

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_swamp_shrine_map.hpp
# Opt level: O1

void __thiscall
PatchOptimizeSwampShrineMap::inject_code(PatchOptimizeSwampShrineMap *this,ROM *rom,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  mapped_type *ppMVar6;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  Code func;
  allocator_type local_11a;
  allocator_type local_119;
  string local_118;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f8;
  World *local_e0;
  AddressRegister local_d8;
  DataRegister local_c8;
  AddressRegister local_b8;
  Code local_a8;
  
  uVar3 = inject_func_disable_spikeballs_progessively(rom);
  uVar4 = inject_func_handle_buttons(rom);
  uVar5 = inject_func_handle_platforms(rom);
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  __l._M_len = 1;
  __l._M_array = &local_c8;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_118,__l,
             &local_119);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f8,__l_00,&local_11a);
  local_b8.super_Register._code = '\a';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_a8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_118,
                  &local_f8,true,&local_b8,LONG);
  if (local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e0 = world;
  if (local_118._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_118._M_dataplus._M_p,
                    local_118.field_2._M_allocated_capacity - (long)local_118._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_118._M_string_length._4_4_ = 2;
  local_118._M_string_length._0_4_ = uVar3;
  md::Code::jsr(&local_a8,(Param *)&local_118);
  local_118._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_118._M_string_length._4_4_ = 2;
  local_118._M_string_length._0_4_ = uVar4;
  md::Code::jsr(&local_a8,(Param *)&local_118);
  local_118._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_118._M_string_length._4_4_ = 2;
  local_118._M_string_length._0_4_ = uVar5;
  md::Code::jsr(&local_a8,(Param *)&local_118);
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"ret","");
  md::Code::label(&local_a8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_118,__l_01,
             &local_119);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_02._M_len = 1;
  __l_02._M_array = &local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f8,__l_02,&local_11a);
  local_b8.super_Register._code = '\a';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_a8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_118,
                  &local_f8,false,&local_b8,LONG);
  if (local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_118._M_dataplus._M_p,
                    local_118.field_2._M_allocated_capacity - (long)local_118._M_dataplus._M_p);
  }
  md::Code::rts(&local_a8);
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  uVar3 = md::ROM::inject_code(rom,&local_a8,&local_118);
  pWVar2 = local_e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_118._M_dataplus._M_p._0_2_ = 0x17;
  ppMVar6 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&pWVar2->_maps,(key_type *)&local_118);
  (*ppMVar6)->_map_update_addr = uVar3;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_disable_spikeballs_progessively = inject_func_disable_spikeballs_progessively(rom);
        uint32_t func_handle_buttons = inject_func_handle_buttons(rom);
        uint32_t func_handle_platforms = inject_func_handle_platforms(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0 });
        {
            func.jsr(func_disable_spikeballs_progessively);
            func.jsr(func_handle_buttons);
            func.jsr(func_handle_platforms);
        }
        func.label("ret");
        func.movem_from_stack({ reg_D0 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_SWAMP_SHRINE_23)->map_update_addr(update_func_addr);
    }